

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_impl.cpp
# Opt level: O2

void __thiscall gamespace::GameScreenImpl::renderTerrain(GameScreenImpl *this)

{
  Program *this_00;
  _Head_base<0UL,_qe::Camera_*,_false> _Var1;
  vec<3,_float,_(glm::qualifier)0> *in_RDX;
  vec3 v;
  vec3 v_00;
  vec3 v_01;
  hexpoint_t local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  mat4 m;
  mat4 mvp;
  
  local_e8.x = 0x4182ef9e;
  local_e8.y = 0;
  uStack_e0 = CONCAT44(uStack_e0._4_4_,0x411f6873);
  glm::translate<float,(glm::qualifier)0>(&m,(glm *)&local_e8,in_RDX);
  glm::operator*(&mvp,&(((this->_cam).camera._M_t.
                         super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>._M_t.
                         super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
                         super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl)->_matrices).pv,&m)
  ;
  this_00 = *(Program **)
             ((long)((this->_ground_indices)._M_elems + -3) + 0x20 +
             (ulong)this->_terrain_render_geometry_pass * 8);
  qe::Program::use(this_00);
  local_b8 = mvp.value[3].field_0._0_8_;
  uStack_b0 = mvp.value[3].field_0._8_8_;
  local_c8 = mvp.value[2].field_0._0_8_;
  uStack_c0 = mvp.value[2].field_0._8_8_;
  local_d8 = mvp.value[1].field_0._0_8_;
  uStack_d0 = mvp.value[1].field_0._8_8_;
  local_e8.x = mvp.value[0].field_0._0_4_;
  local_e8.y = mvp.value[0].field_0._4_4_;
  uStack_e0 = mvp.value[0].field_0._8_8_;
  (*glad_glUniformMatrix4fv)(0,1,'\0',(GLfloat *)&local_e8);
  _logger_e = (*glad_glGetError)();
  if (_logger_e != 0) {
    throw_glerror(_logger_e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/programs.hpp"
                  ,0x67);
  }
  local_b8 = m.value[3].field_0._0_8_;
  uStack_b0 = m.value[3].field_0._8_8_;
  local_c8 = m.value[2].field_0._0_8_;
  uStack_c0 = m.value[2].field_0._8_8_;
  local_d8 = m.value[1].field_0._0_8_;
  uStack_d0 = m.value[1].field_0._8_8_;
  local_e8.x = m.value[0].field_0._0_4_;
  local_e8.y = m.value[0].field_0._4_4_;
  uStack_e0 = m.value[0].field_0._8_8_;
  (*glad_glUniformMatrix4fv)(1,1,'\0',(GLfloat *)&local_e8);
  _logger_e = (*glad_glGetError)();
  if (_logger_e != 0) {
    throw_glerror(_logger_e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/programs.hpp"
                  ,0x67);
  }
  _Var1._M_head_impl =
       (this->_cam).camera._M_t.super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>.
       _M_t.super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
       super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl;
  local_e8 = *(hexpoint_t *)&((_Var1._M_head_impl)->_matrices).v;
  uStack_e0 = *(undefined8 *)
               ((long)&((_Var1._M_head_impl)->_matrices).v.value[0].field_0.field_0 + 8);
  local_d8 = *(undefined8 *)&((_Var1._M_head_impl)->_matrices).v.value[1].field_0;
  uStack_d0 = *(undefined8 *)
               ((long)&((_Var1._M_head_impl)->_matrices).v.value[1].field_0.field_0 + 8);
  local_c8 = *(undefined8 *)&((_Var1._M_head_impl)->_matrices).v.value[2].field_0;
  uStack_c0 = *(undefined8 *)
               ((long)&((_Var1._M_head_impl)->_matrices).v.value[2].field_0.field_0 + 8);
  local_b8 = *(undefined8 *)&((_Var1._M_head_impl)->_matrices).v.value[3].field_0;
  uStack_b0 = *(undefined8 *)
               ((long)&((_Var1._M_head_impl)->_matrices).v.value[3].field_0.field_0 + 8);
  (*glad_glUniformMatrix4fv)(2,1,'\0',(GLfloat *)&local_e8);
  _logger_e = (*glad_glGetError)();
  if (_logger_e != 0) {
    throw_glerror(_logger_e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/programs.hpp"
                  ,0x67);
  }
  if (this->_terrain_render_geometry_pass == false) {
    if ((this->_cam).controlling == true) {
      local_e8.x = 9999;
      local_e8.y = 9999;
    }
    else {
      local_e8 = (this->_selection).lastLookedAtTile;
    }
    (*glad_glUniform2uiv)(8,1,(GLuint *)&local_e8);
    v.field_0.field_0.z = 0.8;
    v.field_0._0_8_ = 0x3f4ccccd3f4ccccd;
    qe::Program::setUniform<5u>(this_00,v);
  }
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 10);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 9);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 6);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 5);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 2);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 1);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 7);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 8);
  if (this->_terrain_render_geometry_pass == false) {
    v_00.field_0.field_0.z = 0.305;
    v_00.field_0._0_8_ = 0x3f1126e93f4ccccd;
    qe::Program::setUniform<5u>(this_00,v_00);
  }
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 0xb);
  if (this->_terrain_render_geometry_pass == false) {
    v_01.field_0.field_0.z = 0.8;
    v_01.field_0._0_8_ = 0x3f0d0e5600000000;
    qe::Program::setUniform<5u>(this_00,v_01);
  }
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 3);
  qe::Mesh<7U>::render_sub
            ((this->_ground)._M_t.
             super___uniq_ptr_impl<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>._M_t.
             super__Tuple_impl<0UL,_qe::Mesh<7U>_*,_std::default_delete<qe::Mesh<7U>_>_>.
             super__Head_base<0UL,_qe::Mesh<7U>_*,_false>._M_head_impl,
             (this->_ground_indices)._M_elems + 4);
  return;
}

Assistant:

void GameScreenImpl::renderTerrain() {
    glm::mat4 m = glm::translate(glm::vec3(18.099, 0, 10.963) + glm::vec3(-2 * 0.866, 0, -1.0));
    glm::mat4 mvp = _cam.camera->matrices().pv * m;
    qe::Program *ts = _terrain_render_geometry_pass ? _terrain_tileno_shader.get() : _terrain_shader.get();
    ts->use();
    ts->setUniform<qe::UNIMVP>(mvp);
    ts->setUniform<qe::UNIM>(m);
    ts->setUniform<qe::UNIV>(_cam.camera->matrices().v);
    if(_terrain_render_geometry_pass == false) {
        if(_cam.controlling) {
            ts->setUniform<qe::UNISEL>(glm::uvec2(9999, 9999));
        } else {
            ts->setUniform<qe::UNISEL>(to_uvec2(_selection.lastLookedAtTile));
        }
        ts->setUniform<qe::UNICOLOR>(glm::vec3(0.8, 0.8, 0.8));
    }
    // render grey areas
    _ground->render_sub(_ground_indices[DamMain_CUBezierCurve]);
    _ground->render_sub(_ground_indices[DamBaseBottom_Cube_001]);
    _ground->render_sub(_ground_indices[DamBaseBottom_001_Cube_002]);
    _ground->render_sub(_ground_indices[DamBaseBottom_002_Cube_003]);
    _ground->render_sub(_ground_indices[Cylinder_Cylinder_003]);
    _ground->render_sub(_ground_indices[Cylinder_001_Cylinder_006]);
    _ground->render_sub(_ground_indices[Cylinder_002_Cylinder_007]);
    // TODO render faction colors
    _ground->render_sub(_ground_indices[DamBaseMiddle_001_Cylinder_001]);
    _ground->render_sub(_ground_indices[DamBaseTop_001_Cone_001]);
    // render ground areas
    if(_terrain_render_geometry_pass == false) ts->setUniform<qe::UNICOLOR>(glm::vec3(0.8, 0.567, 0.305));
    _ground->render_sub(_ground_indices[Ground_Plane_002]);
    // render water
    if(_terrain_render_geometry_pass == false) ts->setUniform<qe::UNICOLOR>(glm::vec3(0.0, 0.551, 0.8));
    _ground->render_sub(_ground_indices[WaterPlane_Plane_003]);
    _ground->render_sub(_ground_indices[WaterBlock_Cube_004]);
}